

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O0

sarima_object sarima_init(int p,int d,int q,int s,int P,int D,int Q,int N)

{
  sarima_object psVar1;
  int local_30;
  int local_2c;
  int M;
  int i;
  sarima_object obj;
  int D_local;
  int P_local;
  int s_local;
  int q_local;
  int d_local;
  int p_local;
  
  if ((d == 0) && (D == 0)) {
    local_30 = 1;
  }
  else {
    local_30 = 0;
  }
  if (((((-1 < p) && (-1 < d)) && (-1 < q)) && ((0 < N && (-1 < P)))) &&
     ((-1 < D && ((-1 < Q && (-1 < s)))))) {
    psVar1 = (sarima_object)
             malloc((long)(((p + q + P + Q + N) - d) - s * D) * 8 + 0x98 +
                    (long)(p + q + P + Q + local_30) * 8 * (long)(p + q + P + Q + local_30));
    psVar1->p = p;
    psVar1->d = d;
    psVar1->q = q;
    psVar1->N = N;
    psVar1->s = s;
    psVar1->P = P;
    psVar1->D = D;
    psVar1->Q = Q;
    psVar1->Nused = (N - d) - s * D;
    psVar1->M = local_30;
    psVar1->retval = 0;
    psVar1->cssml = 1;
    for (local_2c = 0; local_2c < p + q + P + Q; local_2c = local_2c + 1) {
      *(undefined8 *)(&psVar1[1].N + (long)local_2c * 2) = 0;
    }
    psVar1->phi = (double *)(psVar1 + 1);
    psVar1->theta = (double *)(&psVar1[1].N + (long)p * 2);
    psVar1->PHI = (double *)(&psVar1[1].N + (long)(p + q) * 2);
    psVar1->THETA = (double *)(&psVar1[1].N + (long)(p + q + P) * 2);
    psVar1->res = (double *)(&psVar1[1].N + (long)(p + q + P + Q) * 2);
    psVar1->vcov = (double *)(&psVar1[1].N + (long)(((p + q + P + Q + N) - d) - s * D) * 2);
    psVar1->method = 0;
    psVar1->optmethod = 5;
    psVar1->mean = 0.0;
    psVar1->var = 1.0;
    psVar1->lvcov = (p + q + P + Q + local_30) * (p + q + P + Q + local_30);
    psVar1->ncoeff = p + q + P + Q + local_30;
    return psVar1;
  }
  printf("\n Input Values cannot be Negative. Program Exiting. \n");
  exit(-1);
}

Assistant:

sarima_object sarima_init(int p, int d, int q,int s, int P,int D,int Q, int N) {
	sarima_object obj = NULL;
	int i, M;

	if (d == 0 && D == 0) {
		M = 1;
	}
	else {
		M = 0;
	}

	if (p < 0 || d < 0 || q < 0 || N <= 0 || P < 0 || D < 0 || Q < 0 || s < 0) {
		printf("\n Input Values cannot be Negative. Program Exiting. \n");
		exit(-1);
	}

	//retval = 0 Input Error
	// retval = 1 Probable Success
	// retval = 4 Optimization Routine didn't converge
	// Retval = 15 Optimization Routine Encountered Inf/Nan Values

	obj = (sarima_object)malloc(sizeof(struct sarima_set) + sizeof(double)* (p + q + P + Q + N - d - s*D) + sizeof(double)* (p + q + P + Q + M)*(p + q + P + Q + M));

	obj->p = p;
	obj->d = d;
	obj->q = q;
	obj->N = N;
	obj->s = s;
	obj->P = P;
	obj->D = D;
	obj->Q = Q;
	obj->Nused = N - d - s*D;
	obj->M = M;
	obj->retval = 0;
	obj->cssml = 1;

	for (i = 0; i < p + q+P+Q; ++i) {
		obj->params[i] = 0.0;
	}
	obj->phi = &obj->params[0];
	obj->theta = &obj->params[p];
	obj->PHI = &obj->params[p + q];
	obj->THETA = &obj->params[p + q + P];
	obj->res = &obj->params[p + q+P+Q];
	obj->vcov = &obj->params[p + q + P + Q+ N - d - s*D];

	obj->method = 0;// 0 - MLE, 1 - CSS, 2 - Box-Jenkins
	obj->optmethod = 5; // Default Method is 5
	obj->mean = 0.0;
	obj->var = 1.0;
	obj->lvcov = (p + q + P + Q + M)*(p + q + P + Q + M);
	obj->ncoeff = p + q + P + Q + M;

	return obj;
}